

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ConvertDecimal<int*>
               (int *src_ptr,Vector *vector,ArrowArray *array,idx_t size,int64_t nested_offset,
               uint64_t parent_offset,ArrowScanLocalState *scan_state,ValidityMask *val_mask,
               DecimalBitWidth arrow_bit_width)

{
  PhysicalType type;
  void *pvVar1;
  bool bVar2;
  long lVar3;
  NotImplementedException *this;
  PhysicalType type_00;
  int16_t *result;
  int64_t *result_00;
  hugeint_t *result_01;
  int32_t *result_02;
  idx_t row;
  idx_t iVar4;
  allocator local_71;
  string local_70;
  string local_50;
  
  type = (vector->type).physical_type_;
  if (type == INT128) {
    if (arrow_bit_width != DECIMAL_128) {
      result_01 = (hugeint_t *)vector->data;
      for (iVar4 = 0; size != iVar4; iVar4 = iVar4 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
        if (bVar2) {
          TryCast::Operation<int,duckdb::hugeint_t>(src_ptr[iVar4],result_01,false);
        }
        result_01 = result_01 + 1;
      }
      return;
    }
  }
  else if (type == INT32) {
    if (arrow_bit_width != DECIMAL_32) {
      result_02 = (int32_t *)vector->data;
      for (iVar4 = 0; size != iVar4; iVar4 = iVar4 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
        if (bVar2) {
          TryCast::Operation<int,int>(src_ptr[iVar4],result_02,false);
        }
        result_02 = result_02 + 1;
      }
      return;
    }
  }
  else {
    if (type != INT64) {
      if (type == INT16) {
        result = (int16_t *)vector->data;
        for (iVar4 = 0; size != iVar4; iVar4 = iVar4 + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
          if (bVar2) {
            TryCast::Operation<int,short>(src_ptr[iVar4],result,false);
          }
          result = result + 1;
        }
        return;
      }
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unsupported physical type for Decimal: %s",&local_71);
      TypeIdToString_abi_cxx11_(&local_70,(duckdb *)(ulong)(vector->type).physical_type_,type_00);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,&local_50,&local_70);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (arrow_bit_width != DECIMAL_64) {
      result_00 = (int64_t *)vector->data;
      for (iVar4 = 0; size != iVar4; iVar4 = iVar4 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
        if (bVar2) {
          TryCast::Operation<int,long>(src_ptr[iVar4],result_00,false);
        }
        result_00 = result_00 + 1;
      }
      return;
    }
  }
  pvVar1 = array->buffers[1];
  iVar4 = GetTypeIdSize(type);
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar3 = lVar3 + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar3 = array->offset + nested_offset;
  }
  vector->data = (data_ptr_t)(lVar3 * iVar4 + (long)pvVar1);
  return;
}

Assistant:

void ConvertDecimal(SRC src_ptr, Vector &vector, ArrowArray &array, idx_t size, int64_t nested_offset,
                    uint64_t parent_offset, ArrowScanLocalState &scan_state, ValidityMask &val_mask,
                    DecimalBitWidth arrow_bit_width) {

	switch (vector.GetType().InternalType()) {
	case PhysicalType::INT16: {
		auto tgt_ptr = FlatVector::GetData<int16_t>(vector);
		for (idx_t row = 0; row < size; row++) {
			if (val_mask.RowIsValid(row)) {
				auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
				D_ASSERT(result);
				(void)result;
			}
		}
		break;
	}
	case PhysicalType::INT32: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_32) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int32_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT64: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_64) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int64_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT128: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_128) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<hugeint_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}

		break;
	}
	default:
		throw NotImplementedException("Unsupported physical type for Decimal: %s",
		                              TypeIdToString(vector.GetType().InternalType()));
	}
}